

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_attribute __thiscall
pugi::xml_node::attribute(xml_node *this,char_t *name_,xml_attribute *hint_)

{
  xml_attribute_struct *attr;
  bool bVar1;
  bool local_61;
  bool local_51;
  char_t *jname;
  xml_attribute_struct *j;
  char_t *iname;
  xml_attribute_struct *i;
  xml_attribute_struct *hint;
  xml_attribute *hint__local;
  char_t *name__local;
  xml_node *this_local;
  
  attr = hint_->_attr;
  local_51 = true;
  if (attr != (xml_attribute_struct *)0x0) {
    local_61 = false;
    if (this->_root != (xml_node_struct *)0x0) {
      local_61 = impl::anon_unknown_0::is_attribute_of(attr,this->_root);
    }
    local_51 = local_61;
  }
  if (local_51 != false) {
    iname = (char_t *)attr;
    if (this->_root == (xml_node_struct *)0x0) {
      xml_attribute::xml_attribute((xml_attribute *)&this_local);
    }
    else {
      for (; iname != (char_t *)0x0; iname = *(char_t **)(iname + 0x20)) {
        if ((*(char_t **)(iname + 8) != (char_t *)0x0) &&
           (bVar1 = impl::anon_unknown_0::strequal(name_,*(char_t **)(iname + 8)), bVar1)) {
          hint_->_attr = *(xml_attribute_struct **)(iname + 0x20);
          xml_attribute::xml_attribute((xml_attribute *)&this_local,(xml_attribute_struct *)iname);
          return (xml_attribute)(xml_attribute_struct *)this_local;
        }
      }
      for (jname = (char_t *)this->_root->first_attribute;
          jname != (char_t *)0x0 && (xml_attribute_struct *)jname != attr;
          jname = *(char_t **)(jname + 0x20)) {
        if ((*(char_t **)(jname + 8) != (char_t *)0x0) &&
           (bVar1 = impl::anon_unknown_0::strequal(name_,*(char_t **)(jname + 8)), bVar1)) {
          hint_->_attr = *(xml_attribute_struct **)(jname + 0x20);
          xml_attribute::xml_attribute((xml_attribute *)&this_local,(xml_attribute_struct *)jname);
          return (xml_attribute)(xml_attribute_struct *)this_local;
        }
      }
      xml_attribute::xml_attribute((xml_attribute *)&this_local);
    }
    return (xml_attribute)(xml_attribute_struct *)this_local;
  }
  __assert_fail("!hint || (_root && impl::is_attribute_of(hint, _root))",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                ,0x1619,
                "xml_attribute pugi::xml_node::attribute(const char_t *, xml_attribute &) const");
}

Assistant:

PUGI__FN xml_attribute xml_node::attribute(const char_t* name_, xml_attribute& hint_) const
	{
		xml_attribute_struct* hint = hint_._attr;

		// if hint is not an attribute of node, behavior is not defined
		assert(!hint || (_root && impl::is_attribute_of(hint, _root)));

		if (!_root) return xml_attribute();

		// optimistically search from hint up until the end
		for (xml_attribute_struct* i = hint; i; i = i->next_attribute)
		{
			const char_t* iname = i->name;
			if (iname && impl::strequal(name_, iname))
			{
				// update hint to maximize efficiency of searching for consecutive attributes
				hint_._attr = i->next_attribute;

				return xml_attribute(i);
			}
		}

		// wrap around and search from the first attribute until the hint
		// 'j' null pointer check is technically redundant, but it prevents a crash in case the assertion above fails
		for (xml_attribute_struct* j = _root->first_attribute; j && j != hint; j = j->next_attribute)
		{
			const char_t* jname = j->name;
			if (jname && impl::strequal(name_, jname))
			{
				// update hint to maximize efficiency of searching for consecutive attributes
				hint_._attr = j->next_attribute;

				return xml_attribute(j);
			}
		}

		return xml_attribute();
	}